

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall
CAssignSubscriptStm::CAssignSubscriptStm
          (CAssignSubscriptStm *this,CIdExp *idExpression,IExpression *offset,
          IExpression *valueExpression)

{
  unique_ptr<IExpression,_std::default_delete<IExpression>_> local_60;
  unique_ptr<IExpression,_std::default_delete<IExpression>_> local_58;
  unique_ptr<CIdExp,_std::default_delete<CIdExp>_> local_50 [3];
  PositionInfo local_38;
  IExpression *local_28;
  IExpression *valueExpression_local;
  IExpression *offset_local;
  CIdExp *idExpression_local;
  CAssignSubscriptStm *this_local;
  
  local_28 = valueExpression;
  valueExpression_local = offset;
  offset_local = &idExpression->super_IExpression;
  idExpression_local = (CIdExp *)this;
  IStatement::IStatement((IStatement *)this);
  (this->super_IStatement).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_002372a0;
  std::unique_ptr<CIdExp,std::default_delete<CIdExp>>::unique_ptr<std::default_delete<CIdExp>,void>
            ((unique_ptr<CIdExp,std::default_delete<CIdExp>> *)&this->idExpression);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&this->indexExpression);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&this->valueExpression);
  local_38 = PositionInfo::operator+
                       (&(offset_local->super_PositionedNode).position,
                        &(local_28->super_PositionedNode).position);
  (this->super_IStatement).super_PositionedNode.position = local_38;
  std::unique_ptr<CIdExp,std::default_delete<CIdExp>>::unique_ptr<std::default_delete<CIdExp>,void>
            ((unique_ptr<CIdExp,std::default_delete<CIdExp>> *)local_50,(pointer)offset_local);
  std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator=(&this->idExpression,local_50);
  std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::~unique_ptr(local_50);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&local_58,
             valueExpression_local);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator=
            (&this->indexExpression,&local_58);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::~unique_ptr(&local_58);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&local_60,local_28);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator=
            (&this->valueExpression,&local_60);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::~unique_ptr(&local_60);
  return;
}

Assistant:

CAssignSubscriptStm::CAssignSubscriptStm(
	CIdExp* idExpression,
	IExpression* offset,
	IExpression* valueExpression
) {
	this->position = idExpression->position + valueExpression->position;
	this->idExpression = std::unique_ptr<CIdExp>(idExpression);
	this->indexExpression = std::unique_ptr<IExpression>(offset);
	this->valueExpression = std::unique_ptr<IExpression>(valueExpression);
}